

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edge.cc
# Opt level: O2

void __thiscall tchecker::system::edges_t::add_edges(edges_t *this,edges_t *edges)

{
  __shared_ptr<tchecker::system::edge_t,_(__gnu_cxx::_Lock_policy)2> *p_Var1;
  __shared_ptr<tchecker::system::edge_t,_(__gnu_cxx::_Lock_policy)2> *__r;
  edge_const_shared_ptr_t edge;
  process_id_t *local_38;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_30;
  
  p_Var1 = &((edges->_edges).
             super__Vector_base<std::shared_ptr<tchecker::system::edge_t>,_std::allocator<std::shared_ptr<tchecker::system::edge_t>_>_>
             ._M_impl.super__Vector_impl_data._M_finish)->
            super___shared_ptr<tchecker::system::edge_t,_(__gnu_cxx::_Lock_policy)2>;
  for (__r = &((edges->_edges).
               super__Vector_base<std::shared_ptr<tchecker::system::edge_t>,_std::allocator<std::shared_ptr<tchecker::system::edge_t>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->
              super___shared_ptr<tchecker::system::edge_t,_(__gnu_cxx::_Lock_policy)2>;
      __r != p_Var1; __r = __r + 1) {
    std::__shared_ptr<tchecker::system::edge_t_const,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<tchecker::system::edge_t,void>
              ((__shared_ptr<tchecker::system::edge_t_const,(__gnu_cxx::_Lock_policy)2> *)&local_38,
               __r);
    add_edge(this,*local_38,local_38[2],local_38[3],local_38[4],(attributes_t *)(local_38 + 6));
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_30);
  }
  return;
}

Assistant:

void edges_t::add_edges(tchecker::system::edges_t const & edges)
{
  for (tchecker::system::edge_const_shared_ptr_t edge : edges._edges)
    add_edge(edge->pid(), edge->src(), edge->tgt(), edge->event_id(), edge->attributes());
}